

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

int __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::
WriteStringVec2File(NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>
                    *this,string *name,function<void_(mp::StringFileWriter_&)> *swf)

{
  anon_class_40_2_9bb43b96 *in_RDX;
  string *in_RSI;
  function<mp::File_(bool)> *in_RDI;
  StringFileWriter sw;
  int lMax;
  StringFileWriter *in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar1;
  TOpener *in_stack_ffffffffffffff50;
  int *in_stack_ffffffffffffff58;
  StringFileWriter *in_stack_ffffffffffffff60;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffff60,in_RSI);
  std::function<mp::File(bool)>::
  function<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::WriteStringVec2File(std::__cxx11::string_const&,std::function<void(mp::StringFileWriter&)>)::_lambda(bool)_1_,void>
            (in_RDI,in_RDX);
  StringFileWriter::StringFileWriter
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::function<mp::File_(bool)>::~function((function<mp::File_(bool)> *)0x10eab4);
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::
  WriteStringVec2File(std::__cxx11::string_const&,std::function<void(mp::StringFileWriter&)>)::
  {lambda(bool)#1}::~function((anon_class_40_2_9bb43b96 *)0x10eabe);
  std::function<void_(mp::StringFileWriter_&)>::operator()
            ((function<void_(mp::StringFileWriter_&)> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28
            );
  iVar1 = 0;
  StringFileWriter::~StringFileWriter((StringFileWriter *)(ulong)in_stack_ffffffffffffff30);
  return iVar1;
}

Assistant:

int NLWriter2<Params>::WriteStringVec2File(
    const std::string& name, std::function<void(StringFileWriter&)> swf) {
  int lMax=0;
  StringFileWriter sw(lMax,
                      [name, this](bool fClose){
    return Utils().openf(name.c_str(),
                         fClose, "w");
  });
  swf(sw);
  return lMax;
}